

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a,Integer g_b,Integer trans)

{
  long lVar1;
  C_Integer *pCVar2;
  undefined8 uVar3;
  int iVar4;
  Integer IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  Integer IVar13;
  Integer *mapc;
  void *pvVar14;
  logical lVar15;
  Integer IVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  long lVar20;
  long lVar21;
  long lVar22;
  int *piVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  long lVar26;
  long *plVar27;
  float *pfVar28;
  double *pdVar29;
  undefined8 *puVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  int *piVar36;
  long *plVar37;
  float *pfVar38;
  double *pdVar39;
  uint uVar40;
  long lVar41;
  Integer IVar42;
  _sparse_array *p_Var43;
  long lVar44;
  ulong uVar45;
  float fVar46;
  float fVar47;
  long local_1c8;
  void *data_c;
  undefined1 (*local_1a8) [16];
  long local_1a0;
  Integer local_198;
  void *local_190;
  Integer local_188;
  Integer local_180;
  long local_178;
  undefined1 (*local_170) [16];
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_140;
  undefined1 (*local_138) [16];
  Integer local_130;
  Integer local_128;
  undefined1 (*local_120) [16];
  Integer tlo_c [2];
  long local_108;
  long local_100;
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_a;
  Integer jhi_a;
  Integer jlo_a;
  void *jptr_a;
  void *iptr_a;
  Integer ld_b [2];
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  lVar1 = s_a + 1000;
  lVar21 = g_b + 1000;
  local_198 = trans;
  IVar13 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  local_190 = (void *)pnga_pgroup_nodeid(SPA[lVar1].grp);
  lVar41 = (long)_ga_sync_begin;
  local_140 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (lVar41 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  if (SPA[lVar1].type != (long)GA[lVar21].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices A and B must match",0);
  }
  local_130 = SPA[lVar1].type;
  if (SPA[lVar1].grp != (long)GA[lVar21].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar21].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be of dimension 2",
               (long)GA[lVar21].ndim);
  }
  if (local_198 == 0) {
    lVar17 = GA[lVar21].dims[0];
  }
  else {
    lVar17 = GA[lVar21].dims[1];
  }
  if (SPA[lVar1].jdim != lVar17) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of A must match row dimension of B"
               ,0);
  }
  pCVar2 = GA->dims + 1;
  if (local_198 != 0) {
    pCVar2 = GA->dims;
  }
  IVar5 = pCVar2[lVar21 * 0x6d];
  IVar16 = SPA[lVar1].idim;
  IVar42 = IVar5;
  if (local_198 == 0) {
    IVar16 = IVar5;
    IVar42 = SPA[lVar1].idim;
  }
  local_1a0 = lVar41;
  pnga_mask_sync(lVar41,local_140);
  lVar41 = 0;
  local_128 = pnga_create_handle();
  local_48 = IVar42;
  local_40 = IVar16;
  pnga_set_data(local_128,2,&local_48,local_130);
  mapc = (Integer *)malloc(IVar13 * 8 + 8);
  pvVar14 = malloc(IVar13 * 8);
  lVar21 = 0;
  if (0 < IVar13) {
    lVar21 = IVar13;
  }
  for (; p_Var43 = SPA, lVar21 != lVar41; lVar41 = lVar41 + 1) {
    *(undefined8 *)((long)pvVar14 + lVar41 * 8) = 0;
  }
  *(Integer *)((long)pvVar14 + (long)local_190 * 8) = (SPA[lVar1].ihi - SPA[lVar1].ilo) + 1;
  pnga_pgroup_gop(p_Var43[lVar1].grp,0x3ea,pvVar14,IVar13,"+");
  IVar42 = local_128;
  *mapc = 1;
  if (local_198 == 0) {
    lVar41 = 1;
    for (lVar17 = lVar41; lVar17 < IVar13; lVar17 = lVar17 + 1) {
      lVar41 = lVar41 + *(long *)((long)pvVar14 + lVar17 * 8 + -8);
      mapc[lVar17] = lVar41;
    }
    mapc[IVar13] = 1;
    local_50 = 1;
    local_58 = IVar13;
  }
  else {
    mapc[1] = 1;
    for (IVar16 = 1; local_58 = 1, local_50 = IVar13, IVar16 < IVar13; IVar16 = IVar16 + 1) {
      mapc[IVar16 + 1] = *(long *)((long)pvVar14 + IVar16 * 8 + -8) + mapc[IVar16];
    }
  }
  pnga_set_irreg_distr(local_128,mapc,&local_58);
  pnga_set_pgroup(IVar42,SPA[lVar1].grp);
  lVar17 = local_140;
  lVar41 = local_1a0;
  pnga_mask_sync(local_1a0,local_140);
  lVar15 = pnga_allocate(IVar42);
  if (lVar15 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_mask_sync(lVar41,lVar17);
  pnga_zero(IVar42);
  for (IVar13 = 0; p_Var43 = SPA, IVar13 != lVar21; IVar13 = IVar13 + 1) {
    lo_c[0] = SPA[lVar1].ilo + 1;
    hi_c[0] = SPA[lVar1].ihi + 1;
    pnga_sprs_array_column_distribution(s_a,IVar13,lo_c + 1,hi_c + 1);
    lVar41 = lo_c[1] + 1;
    lVar17 = hi_c[1] + 1;
    if (local_198 == 0) {
      tlo_c[0] = lo_c[0];
      local_108 = hi_c[0];
      local_100 = lVar17;
      tlo_c[1] = lVar41;
    }
    else {
      tlo_c[1] = lo_c[0];
      local_100 = hi_c[0];
      tlo_c[0] = lVar41;
      local_108 = lVar17;
    }
    local_178 = hi_c[0];
    pauVar19 = (undefined1 (*) [16])(lo_c[0] + -1);
    hi_c[1] = lVar17;
    lo_c[1] = lVar41;
    for (lVar20 = 0; lVar20 < p_Var43[lVar1].nblocks; lVar20 = lVar20 + 1) {
      IVar42 = p_Var43[lVar1].blkidx[lVar20];
      if (local_198 == 0) {
        local_188 = (local_108 - tlo_c[0]) + 1;
        local_180 = IVar5;
      }
      else {
        local_180 = (local_100 - tlo_c[1]) + 1;
        local_188 = IVar5;
      }
      pnga_access_ptr(local_128,tlo_c,&local_108,&data_c,&local_188);
      pnga_sprs_array_column_distribution(s_a,IVar42,&jlo_a,&jhi_a);
      pnga_sprs_array_access_col_block(s_a,IVar42,&iptr_a,&jptr_a,&val_a);
      local_1a0 = jlo_a;
      local_168 = jlo_a + 1;
      local_158 = jhi_a + 1;
      local_160 = lVar41;
      local_150 = lVar17;
      if (local_198 != 0) {
        local_160 = local_168;
        local_168 = lVar41;
        local_150 = local_158;
        local_158 = lVar17;
      }
      lVar44 = (local_158 - local_168) + 1;
      lVar22 = (local_150 - local_160) + 1;
      pvVar14 = malloc(lVar22 * lVar44 * SPA[lVar1].size);
      ld_b[0] = lVar44;
      ld_b[1] = lVar22;
      pnga_get(g_b,&local_168,&local_158,pvVar14,ld_b);
      local_190 = jptr_a;
      if (SPA[lVar1].idx_size == 4) {
        switch(local_130) {
        case 0x3e9:
          local_1a8 = (undefined1 (*) [16])((local_158 - local_168) + 1);
          local_1c8 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar22 = (long)pauVar18 - (long)pauVar19;
            uVar40 = *(int *)((long)iptr_a + lVar22 * 4 + 4) - *(int *)((long)iptr_a + lVar22 * 4);
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar44 = *(int *)((long)jptr_a +
                               (long)*(int *)((long)iptr_a + lVar22 * 4) * 4 + uVar32 * 4) -
                       local_1a0;
              if (local_198 == 0) {
                piVar23 = (int *)((long)pvVar14 + lVar44 * 4);
                piVar36 = (int *)((long)data_c + local_1c8);
                for (lVar44 = local_168; lVar44 <= local_158; lVar44 = lVar44 + 1) {
                  *piVar36 = *piVar36 +
                             *piVar23 *
                             *(int *)((long)val_a +
                                     (long)*(int *)((long)iptr_a + lVar22 * 4) * 4 + uVar32 * 4);
                  piVar36 = piVar36 + local_188;
                  piVar23 = piVar23 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar33 = 0; local_168 + lVar33 <= local_158; lVar33 = lVar33 + 1) {
                  piVar23 = (int *)((long)data_c + lVar33 * 4 + local_188 * local_1c8);
                  *piVar23 = *piVar23 +
                             *(int *)((long)pvVar14 + lVar33 * 4 + lVar44 * (long)local_1a8 * 4) *
                             *(int *)((long)val_a +
                                     (long)*(int *)((long)iptr_a + lVar22 * 4) * 4 + uVar32 * 4);
                }
              }
            }
            local_1c8 = local_1c8 + 4;
            local_170 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ea:
          lVar22 = (local_158 - local_168) + 1;
          lVar44 = 0;
          for (pauVar24 = pauVar19; (long)pauVar24 < local_178;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + 1)) {
            lVar26 = (long)pauVar24 - (long)pauVar19;
            iVar4 = *(int *)((long)iptr_a + lVar26 * 4);
            lVar33 = (long)iVar4;
            uVar40 = *(int *)((long)iptr_a + lVar26 * 4 + 4) - iVar4;
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar25 = *(int *)((long)jptr_a + uVar32 * 4 + lVar33 * 4) - local_1a0;
              if (local_198 == 0) {
                for (lVar31 = local_168; lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  plVar27 = (long *)((long)data_c +
                                    (lVar31 - local_168) * local_188 * 8 + lVar26 * 8);
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      (lVar31 - local_168) * lVar22 * 8 + lVar25 * 8) *
                             *(long *)((long)val_a + uVar32 * 8 + lVar33 * 8);
                }
              }
              else {
                for (lVar31 = local_168; lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  plVar27 = (long *)((long)data_c + lVar31 * 8 + local_188 * lVar44 + local_168 * -8
                                    );
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      lVar31 * 8 + local_168 * -8 + lVar25 * lVar22 * 8) *
                             *(long *)((long)val_a + uVar32 * 8 + lVar33 * 8);
                }
              }
            }
            lVar44 = lVar44 + 8;
          }
          break;
        case 0x3eb:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            iVar4 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4);
            lVar44 = (long)iVar4;
            uVar40 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4 + 4) - iVar4;
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar33 = *(int *)((long)jptr_a + uVar32 * 4 + lVar44 * 4) - local_1a0;
              if (local_198 == 0) {
                pfVar28 = (float *)((long)pvVar14 + lVar33 * 4);
                pfVar38 = (float *)((long)data_c + lVar22);
                for (lVar33 = local_168; lVar33 <= local_158; lVar33 = lVar33 + 1) {
                  *pfVar38 = *(float *)((long)val_a + uVar32 * 4 + lVar44 * 4) * *pfVar28 + *pfVar38
                  ;
                  pfVar38 = pfVar38 + local_188;
                  pfVar28 = pfVar28 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar26 = 0; local_168 + lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  *(float *)((long)data_c + lVar26 * 4 + local_188 * lVar22) =
                       *(float *)((long)val_a + uVar32 * 4 + lVar44 * 4) *
                       *(float *)((long)pvVar14 +
                                 lVar26 * 4 + lVar33 * ((local_158 - local_168) + 1) * 4) +
                       *(float *)((long)data_c + lVar26 * 4 + local_188 * lVar22);
                }
              }
            }
            lVar22 = lVar22 + 4;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ec:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            iVar4 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4);
            lVar44 = (long)iVar4;
            uVar40 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4 + 4) - iVar4;
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar33 = *(int *)((long)jptr_a + uVar32 * 4 + lVar44 * 4) - local_1a0;
              if (local_198 == 0) {
                pdVar29 = (double *)((long)pvVar14 + lVar33 * 8);
                pdVar39 = (double *)((long)data_c + lVar22);
                for (lVar33 = local_168; lVar33 <= local_158; lVar33 = lVar33 + 1) {
                  *pdVar39 = *(double *)((long)val_a + uVar32 * 8 + lVar44 * 8) * *pdVar29 +
                             *pdVar39;
                  pdVar39 = pdVar39 + local_188;
                  pdVar29 = pdVar29 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar26 = 0; local_168 + lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  *(double *)((long)data_c + lVar26 * 8 + local_188 * lVar22) =
                       *(double *)((long)val_a + uVar32 * 8 + lVar44 * 8) *
                       *(double *)
                        ((long)pvVar14 + lVar26 * 8 + lVar33 * ((local_158 - local_168) + 1) * 8) +
                       *(double *)((long)data_c + lVar26 * 8 + local_188 * lVar22);
                }
              }
            }
            lVar22 = lVar22 + 8;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ee:
          local_1a8 = (undefined1 (*) [16])((long)pvVar14 + 4);
          local_170 = (undefined1 (*) [16])((long)local_1a8 + local_1a0 * -8);
          local_1c8 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            iVar4 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4);
            uVar40 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4 + 4) - iVar4;
            uVar32 = (ulong)uVar40;
            if ((int)uVar40 < 1) {
              uVar32 = 0;
            }
            for (uVar45 = 0; uVar45 != uVar32; uVar45 = uVar45 + 1) {
              lVar44 = (long)*(int *)((long)jptr_a + uVar45 * 4 + (long)iVar4 * 4);
              lVar22 = uVar45 + (long)iVar4;
              if (local_198 == 0) {
                puVar30 = (undefined8 *)((long)data_c + local_1c8);
                pfVar28 = (float *)(*local_170 + lVar44 * 8);
                for (lVar44 = local_168; lVar44 <= local_158; lVar44 = lVar44 + 1) {
                  uVar3 = *(undefined8 *)((long)val_a + lVar22 * 8);
                  fVar46 = (float)uVar3;
                  fVar47 = (float)((ulong)uVar3 >> 0x20);
                  *puVar30 = CONCAT44((float)((ulong)*puVar30 >> 0x20) +
                                      pfVar28[-1] * fVar47 + fVar46 * *pfVar28,
                                      (float)*puVar30 + pfVar28[-1] * fVar46 + -fVar47 * *pfVar28);
                  puVar30 = puVar30 + local_188;
                  pfVar28 = pfVar28 + (local_158 - local_168) * 2 + 2;
                }
              }
              else {
                lVar33 = (lVar44 - local_1a0) * ((local_158 - local_168) * 8 + 8);
                for (lVar44 = 0; local_168 + lVar44 <= local_158; lVar44 = lVar44 + 1) {
                  uVar3 = *(undefined8 *)((long)val_a + lVar22 * 8);
                  fVar46 = (float)uVar3;
                  fVar47 = (float)((ulong)uVar3 >> 0x20);
                  uVar3 = *(undefined8 *)((long)data_c + lVar44 * 8 + local_188 * local_1c8);
                  *(ulong *)((long)data_c + lVar44 * 8 + local_188 * local_1c8) =
                       CONCAT44((float)((ulong)uVar3 >> 0x20) +
                                *(float *)(local_1a8[-1] + lVar44 * 8 + lVar33 + 0xc) * fVar47 +
                                fVar46 * *(float *)(*local_1a8 + lVar44 * 8 + lVar33),
                                (float)uVar3 +
                                *(float *)(local_1a8[-1] + lVar44 * 8 + lVar33 + 0xc) * fVar46 +
                                -fVar47 * *(float *)(*local_1a8 + lVar44 * 8 + lVar33));
                }
              }
            }
            local_1c8 = local_1c8 + 8;
            local_138 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ef:
          local_1a8 = (undefined1 (*) [16])((long)pvVar14 + 8);
          local_138 = local_1a8 + -local_1a0;
          local_170 = (undefined1 (*) [16])data_c;
          local_1c8 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            iVar4 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4);
            uVar40 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4 + 4) - iVar4;
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar22 = (long)*(int *)((long)jptr_a + uVar32 * 4 + (long)iVar4 * 4);
              lVar44 = ((long)iVar4 + uVar32) * 0x10;
              if (local_198 == 0) {
                pauVar35 = local_138 + lVar22;
                pauVar24 = local_170;
                for (lVar22 = local_168; lVar22 <= local_158; lVar22 = lVar22 + 1) {
                  pdVar29 = (double *)((long)val_a + lVar44);
                  dVar11 = *pdVar29;
                  dVar12 = pdVar29[1];
                  dVar10 = *(double *)(*pauVar24 + 8) +
                           *(double *)(pauVar35[-1] + 8) * dVar12 + dVar11 * *(double *)*pauVar35;
                  auVar7._8_4_ = SUB84(dVar10,0);
                  auVar7._0_8_ = *(double *)*pauVar24 +
                                 *(double *)(pauVar35[-1] + 8) * dVar11 +
                                 -dVar12 * *(double *)*pauVar35;
                  auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
                  *pauVar24 = auVar7;
                  pauVar24 = pauVar24 + local_188;
                  pauVar35 = pauVar35 + (local_158 - local_168) + 1;
                }
              }
              else {
                lVar26 = (lVar22 - local_1a0) * ((local_158 - local_168) * 0x10 + 0x10);
                lVar33 = 0;
                for (lVar22 = local_168; lVar22 <= local_158; lVar22 = lVar22 + 1) {
                  pdVar29 = (double *)((long)val_a + lVar44);
                  dVar11 = *pdVar29;
                  dVar12 = pdVar29[1];
                  pdVar29 = (double *)((long)data_c + lVar33 + local_188 * local_1c8);
                  dVar10 = pdVar29[1] +
                           *(double *)(local_1a8[-1] + lVar33 + lVar26 + 8) * dVar12 +
                           dVar11 * *(double *)(*local_1a8 + lVar33 + lVar26);
                  auVar6._8_4_ = SUB84(dVar10,0);
                  auVar6._0_8_ = *pdVar29 +
                                 *(double *)(local_1a8[-1] + lVar33 + lVar26 + 8) * dVar11 +
                                 -dVar12 * *(double *)(*local_1a8 + lVar33 + lVar26);
                  auVar6._12_4_ = (int)((ulong)dVar10 >> 0x20);
                  *(undefined1 (*) [16])((long)data_c + lVar33 + local_188 * local_1c8) = auVar6;
                  lVar33 = lVar33 + 0x10;
                }
              }
            }
            local_1c8 = local_1c8 + 0x10;
            local_170 = local_170 + 1;
            local_120 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3f8:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            iVar4 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4);
            lVar44 = (long)iVar4;
            uVar40 = *(int *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 4 + 4) - iVar4;
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar40; uVar32 = uVar32 + 1) {
              lVar33 = *(int *)((long)jptr_a + uVar32 * 4 + lVar44 * 4) - local_1a0;
              if (local_198 == 0) {
                plVar27 = (long *)((long)pvVar14 + lVar33 * 8);
                plVar37 = (long *)((long)data_c + lVar22);
                for (lVar33 = local_168; lVar33 <= local_158; lVar33 = lVar33 + 1) {
                  *plVar37 = *plVar37 + *plVar27 * *(long *)((long)val_a + uVar32 * 8 + lVar44 * 8);
                  plVar37 = plVar37 + local_188;
                  plVar27 = plVar27 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar26 = 0; local_168 + lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  plVar27 = (long *)((long)data_c + lVar26 * 8 + local_188 * lVar22);
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      lVar26 * 8 + lVar33 * ((local_158 - local_168) + 1) * 8) *
                             *(long *)((long)val_a + uVar32 * 8 + lVar44 * 8);
                }
              }
            }
            lVar22 = lVar22 + 8;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
        }
      }
      else {
        switch(local_130) {
        case 0x3e9:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar33 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar44;
            if (lVar33 < 1) {
              lVar33 = 0;
            }
            for (lVar26 = 0; lVar26 != lVar33; lVar26 = lVar26 + 1) {
              lVar25 = *(long *)((long)jptr_a + lVar26 * 8 + lVar44 * 8) - local_1a0;
              if (local_198 == 0) {
                piVar23 = (int *)((long)pvVar14 + lVar25 * 4);
                piVar36 = (int *)((long)data_c + lVar22);
                for (lVar25 = local_168; lVar25 <= local_158; lVar25 = lVar25 + 1) {
                  *piVar36 = *piVar36 + *piVar23 * *(int *)((long)val_a + lVar26 * 4 + lVar44 * 4);
                  piVar36 = piVar36 + local_188;
                  piVar23 = piVar23 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar31 = 0; local_168 + lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  piVar23 = (int *)((long)data_c + lVar31 * 4 + local_188 * lVar22);
                  *piVar23 = *piVar23 +
                             *(int *)((long)pvVar14 +
                                     lVar31 * 4 + lVar25 * ((local_158 - local_168) + 1) * 4) *
                             *(int *)((long)val_a + lVar26 * 4 + lVar44 * 4);
                }
              }
            }
            lVar22 = lVar22 + 4;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ea:
          lVar22 = (local_158 - local_168) + 1;
          lVar44 = 0;
          for (pauVar24 = pauVar19; (long)pauVar24 < local_178;
              pauVar24 = (undefined1 (*) [16])(*pauVar24 + 1)) {
            lVar33 = (long)pauVar24 - (long)pauVar19;
            lVar26 = *(long *)((long)iptr_a + lVar33 * 8 + 8) - *(long *)((long)iptr_a + lVar33 * 8)
            ;
            if (lVar26 < 1) {
              lVar26 = 0;
            }
            for (lVar25 = 0; lVar25 != lVar26; lVar25 = lVar25 + 1) {
              lVar31 = *(long *)((long)jptr_a +
                                lVar25 * 8 + *(long *)((long)iptr_a + lVar33 * 8) * 8) - local_1a0;
              if (local_198 == 0) {
                for (lVar34 = local_168; lVar34 <= local_158; lVar34 = lVar34 + 1) {
                  plVar27 = (long *)((long)data_c +
                                    (lVar34 - local_168) * local_188 * 8 + lVar33 * 8);
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      (lVar34 - local_168) * lVar22 * 8 + lVar31 * 8) *
                             *(long *)((long)val_a +
                                      *(long *)((long)iptr_a + lVar33 * 8) * 8 + lVar25 * 8);
                }
              }
              else {
                for (lVar34 = local_168; lVar34 <= local_158; lVar34 = lVar34 + 1) {
                  plVar27 = (long *)((long)data_c + lVar34 * 8 + local_188 * lVar44 + local_168 * -8
                                    );
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      lVar34 * 8 + local_168 * -8 + lVar31 * lVar22 * 8) *
                             *(long *)((long)val_a +
                                      *(long *)((long)iptr_a + lVar33 * 8) * 8 + lVar25 * 8);
                }
              }
            }
            lVar44 = lVar44 + 8;
          }
          break;
        case 0x3eb:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar33 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar44;
            if (lVar33 < 1) {
              lVar33 = 0;
            }
            for (lVar26 = 0; lVar26 != lVar33; lVar26 = lVar26 + 1) {
              lVar25 = *(long *)((long)jptr_a + lVar26 * 8 + lVar44 * 8) - local_1a0;
              if (local_198 == 0) {
                pfVar28 = (float *)((long)pvVar14 + lVar25 * 4);
                pfVar38 = (float *)((long)data_c + lVar22);
                for (lVar25 = local_168; lVar25 <= local_158; lVar25 = lVar25 + 1) {
                  *pfVar38 = *(float *)((long)val_a + lVar26 * 4 + lVar44 * 4) * *pfVar28 + *pfVar38
                  ;
                  pfVar38 = pfVar38 + local_188;
                  pfVar28 = pfVar28 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar31 = 0; local_168 + lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  *(float *)((long)data_c + lVar31 * 4 + local_188 * lVar22) =
                       *(float *)((long)val_a + lVar26 * 4 + lVar44 * 4) *
                       *(float *)((long)pvVar14 +
                                 lVar31 * 4 + lVar25 * ((local_158 - local_168) + 1) * 4) +
                       *(float *)((long)data_c + lVar31 * 4 + local_188 * lVar22);
                }
              }
            }
            lVar22 = lVar22 + 4;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ec:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar33 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar44;
            if (lVar33 < 1) {
              lVar33 = 0;
            }
            for (lVar26 = 0; lVar26 != lVar33; lVar26 = lVar26 + 1) {
              lVar25 = *(long *)((long)jptr_a + lVar26 * 8 + lVar44 * 8) - local_1a0;
              if (local_198 == 0) {
                pdVar29 = (double *)((long)pvVar14 + lVar25 * 8);
                pdVar39 = (double *)((long)data_c + lVar22);
                for (lVar25 = local_168; lVar25 <= local_158; lVar25 = lVar25 + 1) {
                  *pdVar39 = *(double *)((long)val_a + lVar26 * 8 + lVar44 * 8) * *pdVar29 +
                             *pdVar39;
                  pdVar39 = pdVar39 + local_188;
                  pdVar29 = pdVar29 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar31 = 0; local_168 + lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  *(double *)((long)data_c + lVar31 * 8 + local_188 * lVar22) =
                       *(double *)((long)val_a + lVar26 * 8 + lVar44 * 8) *
                       *(double *)
                        ((long)pvVar14 + lVar31 * 8 + lVar25 * ((local_158 - local_168) + 1) * 8) +
                       *(double *)((long)data_c + lVar31 * 8 + local_188 * lVar22);
                }
              }
            }
            lVar22 = lVar22 + 8;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ee:
          local_1a8 = (undefined1 (*) [16])((long)pvVar14 + 4);
          local_170 = (undefined1 (*) [16])((long)local_1a8 + local_1a0 * -8);
          local_1c8 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar22 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar22;
            if (lVar44 < 1) {
              lVar44 = 0;
            }
            for (lVar33 = 0; lVar33 != lVar44; lVar33 = lVar33 + 1) {
              lVar26 = *(long *)((long)jptr_a + lVar33 * 8 + lVar22 * 8);
              if (local_198 == 0) {
                puVar30 = (undefined8 *)((long)data_c + local_1c8);
                pfVar28 = (float *)(*local_170 + lVar26 * 8);
                for (lVar26 = local_168; lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  uVar3 = *(undefined8 *)((long)val_a + (lVar33 + lVar22) * 8);
                  fVar46 = (float)uVar3;
                  fVar47 = (float)((ulong)uVar3 >> 0x20);
                  *puVar30 = CONCAT44((float)((ulong)*puVar30 >> 0x20) +
                                      pfVar28[-1] * fVar47 + fVar46 * *pfVar28,
                                      (float)*puVar30 + pfVar28[-1] * fVar46 + -fVar47 * *pfVar28);
                  puVar30 = puVar30 + local_188;
                  pfVar28 = pfVar28 + (local_158 - local_168) * 2 + 2;
                }
              }
              else {
                lVar25 = (lVar26 - local_1a0) * ((local_158 - local_168) * 8 + 8);
                for (lVar26 = 0; local_168 + lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  uVar3 = *(undefined8 *)((long)val_a + (lVar33 + lVar22) * 8);
                  fVar46 = (float)uVar3;
                  fVar47 = (float)((ulong)uVar3 >> 0x20);
                  uVar3 = *(undefined8 *)((long)data_c + lVar26 * 8 + local_188 * local_1c8);
                  *(ulong *)((long)data_c + lVar26 * 8 + local_188 * local_1c8) =
                       CONCAT44((float)((ulong)uVar3 >> 0x20) +
                                *(float *)(local_1a8[-1] + lVar26 * 8 + lVar25 + 0xc) * fVar47 +
                                fVar46 * *(float *)(*local_1a8 + lVar26 * 8 + lVar25),
                                (float)uVar3 +
                                *(float *)(local_1a8[-1] + lVar26 * 8 + lVar25 + 0xc) * fVar46 +
                                -fVar47 * *(float *)(*local_1a8 + lVar26 * 8 + lVar25));
                }
              }
            }
            local_1c8 = local_1c8 + 8;
            local_138 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3ef:
          local_1a8 = (undefined1 (*) [16])((long)pvVar14 + 8);
          local_138 = local_1a8 + -local_1a0;
          local_170 = (undefined1 (*) [16])data_c;
          local_1c8 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar22 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar22;
            if (lVar44 < 1) {
              lVar44 = 0;
            }
            for (lVar33 = 0; lVar33 != lVar44; lVar33 = lVar33 + 1) {
              lVar26 = *(long *)((long)jptr_a + lVar33 * 8 + lVar22 * 8);
              lVar25 = (lVar33 + lVar22) * 0x10;
              if (local_198 == 0) {
                pauVar35 = local_138 + lVar26;
                pauVar24 = local_170;
                for (lVar26 = local_168; lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  pdVar29 = (double *)((long)val_a + lVar25);
                  dVar11 = *pdVar29;
                  dVar12 = pdVar29[1];
                  dVar10 = *(double *)(*pauVar24 + 8) +
                           *(double *)(pauVar35[-1] + 8) * dVar12 + dVar11 * *(double *)*pauVar35;
                  auVar9._8_4_ = SUB84(dVar10,0);
                  auVar9._0_8_ = *(double *)*pauVar24 +
                                 *(double *)(pauVar35[-1] + 8) * dVar11 +
                                 -dVar12 * *(double *)*pauVar35;
                  auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
                  *pauVar24 = auVar9;
                  pauVar24 = pauVar24 + local_188;
                  pauVar35 = pauVar35 + (local_158 - local_168) + 1;
                }
              }
              else {
                lVar34 = (lVar26 - local_1a0) * ((local_158 - local_168) * 0x10 + 0x10);
                lVar31 = 0;
                for (lVar26 = local_168; lVar26 <= local_158; lVar26 = lVar26 + 1) {
                  pdVar29 = (double *)((long)val_a + lVar25);
                  dVar11 = *pdVar29;
                  dVar12 = pdVar29[1];
                  pdVar29 = (double *)((long)data_c + lVar31 + local_188 * local_1c8);
                  dVar10 = pdVar29[1] +
                           *(double *)(local_1a8[-1] + lVar31 + lVar34 + 8) * dVar12 +
                           dVar11 * *(double *)(*local_1a8 + lVar31 + lVar34);
                  auVar8._8_4_ = SUB84(dVar10,0);
                  auVar8._0_8_ = *pdVar29 +
                                 *(double *)(local_1a8[-1] + lVar31 + lVar34 + 8) * dVar11 +
                                 -dVar12 * *(double *)(*local_1a8 + lVar31 + lVar34);
                  auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
                  *(undefined1 (*) [16])((long)data_c + lVar31 + local_188 * local_1c8) = auVar8;
                  lVar31 = lVar31 + 0x10;
                }
              }
            }
            local_1c8 = local_1c8 + 0x10;
            local_170 = local_170 + 1;
            local_120 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
          break;
        case 0x3f8:
          lVar22 = 0;
          pauVar24 = pauVar19;
          while (pauVar18 = pauVar24, (long)pauVar18 < local_178) {
            lVar44 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8);
            lVar33 = *(long *)((long)iptr_a + ((long)pauVar18 - (long)pauVar19) * 8 + 8) - lVar44;
            if (lVar33 < 1) {
              lVar33 = 0;
            }
            for (lVar26 = 0; lVar26 != lVar33; lVar26 = lVar26 + 1) {
              lVar25 = *(long *)((long)jptr_a + lVar26 * 8 + lVar44 * 8) - local_1a0;
              if (local_198 == 0) {
                plVar27 = (long *)((long)pvVar14 + lVar25 * 8);
                plVar37 = (long *)((long)data_c + lVar22);
                for (lVar25 = local_168; lVar25 <= local_158; lVar25 = lVar25 + 1) {
                  *plVar37 = *plVar37 + *plVar27 * *(long *)((long)val_a + lVar26 * 8 + lVar44 * 8);
                  plVar37 = plVar37 + local_188;
                  plVar27 = plVar27 + (local_158 - local_168) + 1;
                }
              }
              else {
                for (lVar31 = 0; local_168 + lVar31 <= local_158; lVar31 = lVar31 + 1) {
                  plVar27 = (long *)((long)data_c + lVar31 * 8 + local_188 * lVar22);
                  *plVar27 = *plVar27 +
                             *(long *)((long)pvVar14 +
                                      lVar31 * 8 + lVar25 * ((local_158 - local_168) + 1) * 8) *
                             *(long *)((long)val_a + lVar26 * 8 + lVar44 * 8);
                }
              }
            }
            lVar22 = lVar22 + 8;
            local_1a8 = pauVar18;
            pauVar24 = (undefined1 (*) [16])(*pauVar18 + 1);
          }
        }
      }
      free(pvVar14);
      p_Var43 = SPA;
    }
    IVar42 = local_128;
  }
  if ((int)local_140 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  return IVar42;
}

Assistant:

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a, Integer g_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = s_a+GA_OFFSET;
  Integer hdl_b = g_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_a].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  Integer longidx;
  Integer type;
  Integer jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (SPA[hdl_a].type != GA[hdl_b].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_a].type;
  if (SPA[hdl_a].grp != GA[hdl_b].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_b].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be"
    " of dimension 2",GA[hdl_b].ndim);
  }
  if ((trans && SPA[hdl_a].jdim != GA[hdl_b].dims[1]) ||
      (!trans && SPA[hdl_a].jdim != GA[hdl_b].dims[0])) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_a].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_a].size;
  idim = SPA[hdl_a].idim;
  if (trans) {
    jdim = GA[hdl_b].dims[0];
  } else {
    jdim = GA[hdl_b].dims[1];
  }
  /* Construct product array C*/
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = SPA[hdl_a].ihi-SPA[hdl_a].ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_a].grp);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = SPA[hdl_a].ilo+1;
    hi_c[0] = SPA[hdl_a].ihi+1;
    pnga_sprs_array_column_distribution(s_a,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    /* loop over all sub-blocks in column and row block that contribute
     * to target block */
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over non-zero blocks in row in sparse matrix A */
    for (nn=0; nn<SPA[hdl_a].nblocks; nn++) {
      void *iptr_a, *jptr_a;
      Integer ilo_a, ihi_a, jlo_a, jhi_a;
      Integer lo_b[2], hi_b[2], ld_b[2];
      Integer tlo_b[2], thi_b[2];
      void *val_a;
      void *buf_b;
      Integer nelem;
      Integer ii,jlen;
      n = SPA[hdl_a].blkidx[nn];
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Find block of A for multiplication */
      ilo_a = lo_c[0]-1;
      ihi_a = hi_c[0]-1;
      pnga_sprs_array_column_distribution(s_a, n, &jlo_a, &jhi_a);
      /* get pointer to sparse block */
      pnga_sprs_array_access_col_block(s_a, n, &iptr_a, &jptr_a, &val_a);
      lo_b[0] = jlo_a+1;
      hi_b[0] = jhi_a+1;
      lo_b[1] = lo_c[1];
      hi_b[1] = hi_c[1];
      if (trans) {
        tlo_b[0] = lo_b[1];
        thi_b[0] = hi_b[1];
        tlo_b[1] = lo_b[0];
        thi_b[1] = hi_b[0];
      } else {
        tlo_b[0] = lo_b[0];
        thi_b[0] = hi_b[0];
        tlo_b[1] = lo_b[1];
        thi_b[1] = hi_b[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_b[0]-tlo_b[0]+1)*(thi_b[1]-tlo_b[1]+1);
      buf_b = malloc(nelem*SPA[hdl_a].size);
      ld_b[0] = (thi_b[0]-tlo_b[0]+1);
      ld_b[1] = (thi_b[1]-tlo_b[1]+1);
      pnga_get(g_b,tlo_b,thi_b,buf_b,ld_b);
      if (SPA[hdl_a].idx_size == 4) {
        int *idx_a = (int*)iptr_a;
        int *jdx_a = (int*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_a = (int64_t*)iptr_a;
        int64_t *jdx_a = (int64_t*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      }
      free(buf_b);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
  return g_c;
}